

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_positional_reference.cpp
# Opt level: O0

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformPositionalReference(Transformer *this,PGPositionalReference *node)

{
  undefined8 uVar1;
  type pPVar2;
  long in_RDX;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> in_RDI;
  templated_unique_single_t result;
  string *in_stack_ffffffffffffff68;
  ParserException *in_stack_ffffffffffffff70;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  ParsedExpression *in_stack_ffffffffffffff80;
  unsigned_long *in_stack_ffffffffffffff88;
  allocator *paVar3;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> local_58
  ;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [56];
  
  if (*(int *)(in_RDX + 4) < 1) {
    local_4d = 1;
    uVar1 = __cxa_allocate_exception(0x10);
    paVar3 = &local_39;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"Positional reference node needs to be >= 1",paVar3);
    ParserException::ParserException(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_4d = 0;
    __cxa_throw(uVar1,&ParserException::typeinfo,ParserException::~ParserException);
  }
  NumericCast<unsigned_long,int,void>(0);
  this_00 = &local_58;
  make_uniq<duckdb::PositionalReferenceExpression,unsigned_long>(in_stack_ffffffffffffff88);
  pPVar2 = unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
           ::operator*((unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
                        *)this_00);
  SetQueryLocation(in_stack_ffffffffffffff80,(int)((ulong)pPVar2 >> 0x20));
  unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
  unique_ptr<duckdb::PositionalReferenceExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
            (this_00,(unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>_>
                      *)in_stack_ffffffffffffff68);
  unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
  ::~unique_ptr((unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
                 *)0x1a16ea0);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformPositionalReference(duckdb_libpgquery::PGPositionalReference &node) {
	if (node.position <= 0) {
		throw ParserException("Positional reference node needs to be >= 1");
	}
	auto result = make_uniq<PositionalReferenceExpression>(NumericCast<idx_t>(node.position));
	SetQueryLocation(*result, node.location);
	return std::move(result);
}